

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O2

uint __thiscall CompilerStatistics::Total(CompilerStatistics *this)

{
  Timer *pTVar1;
  uint uVar2;
  uint i;
  uint index;
  
  uVar2 = 0;
  for (index = 0; index < (this->timers).count; index = index + 1) {
    pTVar1 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&this->timers,index);
    uVar2 = uVar2 + pTVar1->total;
  }
  return uVar2;
}

Assistant:

unsigned Total()
	{
		unsigned total = 0;

		for(unsigned i = 0; i < timers.size(); i++)
			total += timers[i].total;

		return total;
	}